

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  Parse *pPVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Bitmask BVar5;
  uint uVar6;
  u16 *puVar7;
  sqlite3_index_info *pIdxInfo;
  ulong uVar8;
  ushort uVar9;
  int iVar10;
  undefined4 uVar11;
  ulong uVar12;
  u8 uVar13;
  ulong uVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  ExprList_item *pEVar18;
  int *piVar19;
  ulong uVar20;
  WhereClause *pWVar21;
  ulong uVar22;
  ulong uVar23;
  Bitmask mNext;
  ulong uVar24;
  WhereTerm *pWVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  int bIn;
  sqlite3_index_info *local_98;
  uint local_8c;
  ulong local_88;
  undefined8 local_80;
  int local_74;
  long local_70;
  Bitmask local_68;
  ulong local_60;
  WhereLoopBuilder *local_58;
  WhereLoop *local_50;
  WhereClause *local_48;
  int *local_40;
  Parse *local_38;
  
  local_48 = pBuilder->pWC;
  pPVar2 = pBuilder->pWInfo->pParse;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_50 = pBuilder->pNew;
  bVar1 = local_50->iTab;
  pEVar4 = pBuilder->pOrderBy;
  iVar16 = 0;
  iVar10 = local_48->nTerm;
  if (local_48->nTerm < 1) {
    iVar10 = iVar16;
  }
  puVar7 = &local_48->a->eOperator;
  while (bVar28 = iVar10 != 0, iVar10 = iVar10 + -1, bVar28) {
    if ((*(int *)(puVar7 + 4) == pSVar3->a[bVar1].iCursor) &&
       ((*(ulong *)(puVar7 + 0xe) & mUnusable) == 0)) {
      iVar16 = (iVar16 + 1) - (uint)((*puVar7 & 0xf7ff) == 0);
    }
    puVar7 = puVar7 + 0x20;
  }
  if (pEVar4 == (ExprList *)0x0) {
    local_60 = 0;
  }
  else {
    uVar17 = pEVar4->nExpr;
    pEVar18 = pEVar4->a;
    uVar22 = 0;
    uVar12 = 0;
    if (0 < (int)uVar17) {
      uVar12 = (ulong)uVar17;
    }
    for (; uVar12 != uVar22; uVar22 = uVar22 + 1) {
      if ((pEVar18->pExpr->op != 0x9e) || (pEVar18->pExpr->iTable != pSVar3->a[bVar1].iCursor)) {
        uVar12 = uVar22 & 0xffffffff;
        break;
      }
      pEVar18 = pEVar18 + 1;
    }
    local_60 = 0;
    if ((uint)uVar12 == uVar17) {
      local_60 = (ulong)uVar17;
    }
  }
  lVar27 = (long)iVar16;
  iVar10 = (int)local_60;
  local_88 = mUnusable;
  local_68 = mPrereq;
  local_58 = pBuilder;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pPVar2->db,lVar27 * 0x14 + (long)iVar10 * 8 + 0x70);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pPVar2,"out of memory");
  }
  else {
    piVar19 = &pIdxInfo[1].nOrderBy;
    local_70 = lVar27 * 0xc;
    pIdxInfo->nConstraint = iVar16;
    pIdxInfo->nOrderBy = iVar10;
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)piVar19;
    pIdxInfo->aOrderBy = (sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3);
    pIdxInfo->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3) + iVar10);
    *(WhereClause **)(pIdxInfo + 1) = local_48;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pPVar2;
    pWVar25 = local_48->a;
    uVar17 = local_48->nTerm;
    if ((int)uVar17 < 1) {
      uVar17 = 0;
    }
    local_8c = 0;
    iVar10 = 0;
    uVar12 = local_88;
    uVar22 = local_60;
    local_98 = pIdxInfo;
    local_38 = pPVar2;
    for (uVar26 = 0; pPVar2 = local_38, uVar17 != uVar26; uVar26 = uVar26 + 1) {
      if ((((pWVar25->leftCursor == pSVar3->a[bVar1].iCursor) &&
           ((pWVar25->prereqRight & uVar12) == 0)) &&
          (uVar15 = pWVar25->eOperator, (uVar15 & 0xf7ff) != 0)) &&
         ((((pSVar3->a[bVar1].fg.jointype & 8) == 0 || ((uVar15 & 0x180) == 0)) ||
          ((pWVar25->pExpr->flags & 1) != 0)))) {
        lVar27 = (long)iVar10;
        local_80 = piVar19 + lVar27 * 3;
        piVar19[lVar27 * 3] = (pWVar25->u).leftColumn;
        piVar19[lVar27 * 3 + 2] = uVar26;
        uVar15 = uVar15 & 0x1fff;
        uVar9 = uVar15;
        if (uVar15 == 1) {
          uVar9 = 2;
        }
        if (uVar9 == 0x40) {
          uVar13 = pWVar25->eMatchOp;
LAB_00171b3d:
          *(u8 *)(local_80 + 1) = uVar13;
        }
        else {
          if ((uVar9 & 0x180) != 0) {
            uVar13 = 'H' - (uVar9 == 0x100);
            goto LAB_00171b3d;
          }
          *(char *)(local_80 + 1) = (char)uVar9;
          if (((uVar9 & 0x3c) != 0) &&
             (local_74 = iVar10, local_40 = piVar19,
             iVar16 = sqlite3ExprIsVector(pWVar25->pExpr->pRight), pIdxInfo = local_98,
             uVar12 = local_88, piVar19 = local_40, uVar22 = local_60, iVar10 = local_74,
             iVar16 != 0)) {
            uVar6 = 1 << ((byte)uVar26 & 0x1f);
            if (0xf < uVar26) {
              uVar6 = 0;
            }
            local_8c = local_8c | uVar6;
            if (uVar15 == 0x10) {
              uVar13 = '\b';
            }
            else {
              if (uVar15 != 4) goto LAB_00171b45;
              uVar13 = ' ';
            }
            goto LAB_00171b3d;
          }
        }
LAB_00171b45:
        iVar10 = iVar10 + 1;
      }
      pWVar25 = pWVar25 + 1;
    }
    uVar20 = 0;
    uVar12 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar12 = uVar20;
    }
    for (; uVar12 * 8 != uVar20; uVar20 = uVar20 + 8) {
      *(int *)((long)&pIdxInfo[1].nOrderBy + uVar20 + local_70) =
           (int)*(short *)(*(long *)((long)&pEVar4->a[0].pExpr + uVar20 * 4) + 0x30);
      (&pIdxInfo[1].field_0x14)[uVar20 + local_70] = (&pEVar4->a[0].sortOrder)[uVar20 * 4];
    }
    local_50->rSetup = 0;
    local_50->wsFlags = 0x400;
    local_50->nLTerm = 0;
    (local_50->u).vtab.needFree = '\0';
    uVar17 = pIdxInfo->nConstraint;
    iVar10 = whereLoopResize(local_38->db,local_50,uVar17);
    if (iVar10 == 0) {
      local_80 = (int *)(CONCAT44(local_80._4_4_,local_8c) & 0xffffffff0000ffff);
      iVar10 = whereLoopAddVirtualOne
                         (local_58,local_68,0xffffffffffffffff,0,pIdxInfo,(u16)local_8c,&bIn);
      if (iVar10 == 0) {
        uVar22 = ~local_68;
        iVar10 = 0;
        uVar12 = local_50->prereq & uVar22;
        if (uVar12 != 0) {
          if (bIn == 0) {
            iVar10 = 0;
            uVar26 = 0;
            local_88 = 0;
          }
          else {
            iVar10 = whereLoopAddVirtualOne
                               (local_58,local_68,0xffffffffffffffff,1,local_98,(u16)local_80,&bIn);
            local_88 = local_50->prereq & uVar22;
            uVar26 = (uint)(local_88 == 0);
            pIdxInfo = local_98;
          }
          uVar20 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar20 = 0;
          }
          local_70 = CONCAT44(local_70._4_4_,uVar26);
          local_8c = (uint)(uVar26 == 0);
          uVar8 = 0;
          pWVar21 = local_48;
          local_60 = uVar12;
          while (BVar5 = local_68, iVar10 == 0) {
            uVar24 = 0xffffffffffffffff;
            for (lVar27 = 0; uVar20 * 0xc - lVar27 != 0; lVar27 = lVar27 + 0xc) {
              uVar14 = pWVar21->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar27)].
                       prereqRight & uVar22;
              uVar23 = uVar24;
              if (uVar14 < uVar24) {
                uVar23 = uVar14;
              }
              if (uVar8 < uVar14) {
                uVar24 = uVar23;
              }
            }
            iVar10 = 0;
            if (uVar24 == 0xffffffffffffffff) {
              if ((local_8c & 1) == 0) {
                iVar16 = (int)local_70;
              }
              else {
                iVar10 = whereLoopAddVirtualOne
                                   (local_58,local_68,local_68,0,local_98,(u16)local_80,&bIn);
                pIdxInfo = local_98;
                iVar16 = (int)local_70;
                if (bIn == 0) {
                  iVar16 = 1;
                }
              }
              if (iVar16 == 0 && iVar10 == 0) {
                iVar10 = whereLoopAddVirtualOne
                                   (local_58,local_68,local_68,1,local_98,(u16)local_80,&bIn);
                pIdxInfo = local_98;
              }
              break;
            }
            uVar8 = uVar24;
            if (((uVar24 != uVar12) && (uVar24 != local_88)) &&
               (iVar10 = whereLoopAddVirtualOne
                                   (local_58,local_68,uVar24 | local_68,0,local_98,(u16)local_80,
                                    &bIn), pIdxInfo = local_98, pWVar21 = local_48,
               uVar12 = local_60, local_50->prereq == BVar5)) {
              uVar11 = (int)local_70;
              if (bIn == 0) {
                uVar11 = 1;
              }
              local_70 = CONCAT44(local_70._4_4_,uVar11);
              local_8c = 0;
            }
          }
        }
      }
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
        pIdxInfo = local_98;
      }
      sqlite3DbFreeNN(local_38->db,pIdxInfo);
      return iVar10;
    }
    sqlite3DbFreeNN(pPVar2->db,pIdxInfo);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0),
  ** then there is no point in making any further calls to xBestIndex() 
  ** since they will all return the same result (if the xBestIndex()
  ** implementation is sane). */
  if( rc==SQLITE_OK && (mBest = (pNew->prereq & ~mPrereq))!=0 ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}